

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathQuaternion.cpp
# Opt level: O1

Quaternion *
COLLADABU::Math::Quaternion::nlerp
          (Quaternion *__return_storage_ptr__,Real fT,Quaternion *rkP,Quaternion *rkQ,
          bool shortestPath)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  __return_storage_ptr__->w = 1.0;
  __return_storage_ptr__->x = 0.0;
  __return_storage_ptr__->y = 0.0;
  __return_storage_ptr__->z = 0.0;
  dVar1 = rkP->w;
  dVar2 = rkP->x;
  dVar3 = rkP->y;
  dVar4 = rkP->z;
  dVar7 = rkQ->w;
  dVar8 = rkQ->x;
  dVar5 = rkQ->y;
  dVar6 = rkQ->z;
  if (dVar6 * dVar4 + dVar3 * dVar5 + dVar1 * dVar7 + dVar2 * dVar8 < 0.0 && shortestPath) {
    dVar7 = -dVar7;
    dVar8 = -dVar8;
    dVar5 = -dVar5;
    dVar6 = -dVar6;
  }
  __return_storage_ptr__->w = (dVar7 - dVar1) * fT + dVar1;
  __return_storage_ptr__->x = (dVar8 - dVar2) * fT + dVar2;
  __return_storage_ptr__->y = (dVar5 - dVar3) * fT + dVar3;
  __return_storage_ptr__->z = (dVar6 - dVar4) * fT + dVar4;
  normalise(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Quaternion Quaternion::nlerp( Real fT, const Quaternion& rkP,
                                      const Quaternion& rkQ, bool shortestPath )
        {
            Quaternion result;
            Real fCos = rkP.dot( rkQ );

            if ( fCos < 0.0f && shortestPath )
            {
                result = rkP + fT * ( ( -rkQ ) - rkP );
            }

            else
            {
                result = rkP + fT * ( rkQ - rkP );
            }

            result.normalise();
            return result;
        }